

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseVisibilityTest_Edition2023NestedKeywordName_Test::
~ParseVisibilityTest_Edition2023NestedKeywordName_Test
          (ParseVisibilityTest_Edition2023NestedKeywordName_Test *this)

{
  ZeroCopyInputStream *pZVar1;
  
  (this->super_ParseVisibilityTest).super_Test._vptr_Test = (_func_int **)&PTR__ParserTest_01937440;
  std::
  unique_ptr<google::protobuf::compiler::Parser,_std::default_delete<google::protobuf::compiler::Parser>_>
  ::~unique_ptr(&(this->super_ParseVisibilityTest).parser_);
  std::
  unique_ptr<google::protobuf::io::Tokenizer,_std::default_delete<google::protobuf::io::Tokenizer>_>
  ::~unique_ptr(&(this->super_ParseVisibilityTest).input_);
  pZVar1 = (this->super_ParseVisibilityTest).raw_input_._M_t.
           super___uniq_ptr_impl<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
           .super__Head_base<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_false>._M_head_impl;
  if (pZVar1 != (ZeroCopyInputStream *)0x0) {
    (*pZVar1->_vptr_ZeroCopyInputStream[1])();
  }
  (this->super_ParseVisibilityTest).raw_input_._M_t.
  super___uniq_ptr_impl<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
  .super__Head_base<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_false>._M_head_impl =
       (ZeroCopyInputStream *)0x0;
  DescriptorPool::~DescriptorPool(&(this->super_ParseVisibilityTest).pool_);
  MockErrorCollector::~MockErrorCollector
            ((MockErrorCollector *)&(this->super_ParseVisibilityTest).error_collector_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseVisibilityTest, Edition2023NestedKeywordName) {
  ExpectParsesTo(
      R"schema(
        edition = "2023";
        message MySimpleMessage {
          local.pkg_name.SomeMessage msg = 1;
          export.other_pkg_name.SomeMessage other_msg = 2;
        }
        )schema",
      R"pb(
        message_type {
          name: "MySimpleMessage"
          field {
            name: "msg"
            number: 1
            label: LABEL_OPTIONAL
            type_name: "local.pkg_name.SomeMessage"
          }
          field {
            name: "other_msg"
            number: 2
            label: LABEL_OPTIONAL
            type_name: "export.other_pkg_name.SomeMessage"
          }
        }
        syntax: "editions"
        edition: EDITION_2023
      )pb");
}